

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

QString * __thiscall
QtPrivate::QCalendarMonthValidator::text
          (QString *__return_storage_ptr__,QCalendarMonthValidator *this)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  formatNumber((QString *)&QStack_38,this->m_month,2);
  QCalendarDateSectionValidator::highlightString
            (__return_storage_ptr__,(QString *)&QStack_38,this->m_pos);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QCalendarMonthValidator::text() const
{
    return highlightString(formatNumber(m_month, 2), m_pos);
}